

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O2

bool CivetServer::getParam(char *data,size_t data_len,char *name,string *dst,size_t occurrence)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  vector<char,_std::allocator<char>_> vbuf;
  char buf [256];
  allocator_type local_159;
  string *local_158;
  _Vector_base<char,_std::allocator<char>_> local_150;
  char local_138 [264];
  
  iVar2 = mg_get_var2(data,data_len,name,local_138,0x100,occurrence);
  if (iVar2 < 0) {
    if (iVar2 == -2) {
      local_158 = dst;
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&local_150,0x200,&local_159);
      while (uVar3 = mg_get_var2(data,data_len,name,
                                 local_150._M_impl.super__Vector_impl_data._M_start,
                                 (long)local_150._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_150._M_impl.super__Vector_impl_data._M_start,occurrence
                                ), (int)uVar3 < 0) {
        if (uVar3 != 0xfffffffe) goto LAB_0010a29c;
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)&local_150,
                   ((long)local_150._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_150._M_impl.super__Vector_impl_data._M_start) * 2);
      }
      std::__cxx11::string::
      assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                ((string *)local_158,
                 (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                 local_150._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                 (local_150._M_impl.super__Vector_impl_data._M_start + uVar3));
LAB_0010a29c:
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_150);
      dst = local_158;
      if (-1 < (int)uVar3) {
        return true;
      }
    }
    dst->_M_string_length = 0;
    *(dst->_M_dataplus)._M_p = '\0';
    bVar1 = false;
  }
  else {
    std::__cxx11::string::assign((char *)dst,(ulong)local_138);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool
CivetServer::getParam(const char *data,
                      size_t data_len,
                      const char *name,
                      std::string &dst,
                      size_t occurrence)
{
	char buf[256];
	int r = mg_get_var2(data, data_len, name, buf, sizeof(buf), occurrence);
	if (r >= 0) {
		// dst can contain NUL characters
		dst.assign(buf, r);
		return true;
	} else if (r == -2) {
		// more buffer
		std::vector<char> vbuf(sizeof(buf) * 2);
		for (;;) {
			r = mg_get_var2(
			    data, data_len, name, &vbuf[0], vbuf.size(), occurrence);
			if (r >= 0) {
				dst.assign(vbuf.begin(), vbuf.begin() + r);
				return true;
			} else if (r != -2) {
				break;
			}
			// more buffer
			vbuf.resize(vbuf.size() * 2);
		}
	}
	dst.clear();
	return false;
}